

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O0

void __thiscall
AlsavoSession::Connect
          (AlsavoSession *this,string *serverIP,int16_t serverPort,string *serial,string *passwd)

{
  uint16_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  Verbosity VVar6;
  time_t tVar7;
  void *data;
  char *pcVar8;
  longlong lVar9;
  rep rVar10;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  undefined1 local_364 [4];
  uint32_t act;
  AuthResponse resp;
  uchar respdata [16];
  AuthChallenge *challenge;
  undefined1 local_310 [4];
  int bytesReceived;
  AuthIntro intro;
  char rcvBuf [512];
  int64_t s;
  MD5_CTX ctx;
  string *passwd_local;
  string *serial_local;
  int16_t serverPort_local;
  string *serverIP_local;
  AlsavoSession *this_local;
  
  ctx.block._56_8_ = passwd;
  std::__cxx11::string::operator=((string *)&this->m_SerialNo,(string *)serial);
  std::__cxx11::string::operator=((string *)&this->m_Password,(string *)ctx.block._56_8_);
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  MD5_Init((MD5_CTX *)&s);
  data = (void *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::length();
  MD5_Update((MD5_CTX *)&s,data,(ulong)uVar2);
  MD5_Final(this->m_HashedPW,(MD5_CTX *)&s);
  memset(&this->m_DestAddr,0,0x10);
  (this->m_DestAddr).sin_family = 2;
  uVar1 = htons(serverPort);
  (this->m_DestAddr).sin_port = uVar1;
  pcVar8 = (char *)std::__cxx11::string::c_str();
  inet_pton(2,pcVar8,&(this->m_DestAddr).sin_addr);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  lVar9 = atoll(pcVar8);
  uVar3 = htonl((uint32_t)lVar9);
  uVar4 = htonl((uint32_t)((ulong)lVar9 >> 0x20));
  this->m_SerialQ = CONCAT44(uVar3,uVar4);
  Disconnect(this);
  uVar2 = rand();
  iVar5 = rand();
  this->m_ClientToken = uVar2 | iVar5 << 0x10;
  iVar5 = socket(2,2,0);
  this->m_Sock = iVar5;
  VVar6 = loguru::current_verbosity_cutoff();
  if (-1 < VVar6) {
    __x = (double)std::__cxx11::string::c_str();
    loguru::log(__x);
  }
  AuthIntro::AuthIntro((AuthIntro *)local_310,this->m_ClientToken,this->m_SerialQ);
  sendto(this->m_Sock,local_310,0x38,0,(sockaddr *)&this->m_DestAddr,0x10);
  iVar5 = RecvWithTimeout(this,(char *)&intro.timestamp,0x200,2000);
  if (iVar5 == 0) {
    VVar6 = loguru::current_verbosity_cutoff();
    if (-3 < VVar6) {
      loguru::log(__x_00);
    }
    Disconnect(this);
  }
  else if ((((rcvBuf[8] == '\x03') && (rcvBuf[9] == '\0')) && (rcvBuf[10] == '\0')) &&
          (rcvBuf[0xb] == '\0')) {
    this->m_CSID = intro.timestamp._4_4_;
    this->m_DSID = rcvBuf._0_4_;
    this->m_ServerToken = rcvBuf._12_4_;
    VVar6 = loguru::current_verbosity_cutoff();
    if (-1 < VVar6) {
      loguru::log(__x_02);
    }
    MD5_Init((MD5_CTX *)&s);
    MD5_Update((MD5_CTX *)&s,&this->m_ClientToken,4);
    MD5_Update((MD5_CTX *)&s,&this->m_ServerToken,4);
    MD5_Update((MD5_CTX *)&s,this->m_HashedPW,0x10);
    MD5_Final((uchar *)&resp.timestamp,(MD5_CTX *)&s);
    AuthResponse::AuthResponse
              ((AuthResponse *)local_364,this->m_CSID,this->m_DSID,(uchar *)&resp.timestamp);
    sendto(this->m_Sock,local_364,0x2c,0,(sockaddr *)&this->m_DestAddr,0x10);
    iVar5 = RecvWithTimeout(this,(char *)&intro.timestamp,0x200,2000);
    if (iVar5 == 0) {
      VVar6 = loguru::current_verbosity_cutoff();
      if (-3 < VVar6) {
        loguru::log(__x_03);
      }
      Disconnect(this);
    }
    else if (rcvBuf._8_4_ == 5) {
      rVar10 = std::chrono::_V2::system_clock::now();
      (this->m_LastPacketRcvTime).__d.__r = rVar10;
      UpdateConnectionStatus(this,Connected);
      VVar6 = loguru::current_verbosity_cutoff();
      if (-1 < VVar6) {
        loguru::log(__x_05);
      }
    }
    else {
      VVar6 = loguru::current_verbosity_cutoff();
      if (-3 < VVar6) {
        loguru::log(__x_04);
      }
      Disconnect(this);
    }
  }
  else {
    VVar6 = loguru::current_verbosity_cutoff();
    if (-3 < VVar6) {
      loguru::log(__x_01);
    }
    Disconnect(this);
  }
  return;
}

Assistant:

void Connect(const std::string serverIP, int16_t serverPort, const std::string &serial, const std::string &passwd)
	{
		m_SerialNo = serial;
		m_Password = passwd;

		srand((uint32_t)time(NULL));

		MD5_CTX ctx;
		MD5_Init(&ctx);
		MD5_Update(&ctx, (char*)m_Password.c_str(), (unsigned int)m_Password.length());
		MD5_Final(m_HashedPW, &ctx);

		memset(&m_DestAddr, 0, sizeof(sockaddr_in));
		m_DestAddr.sin_family = AF_INET;
		m_DestAddr.sin_port = htons(serverPort);
		inet_pton(AF_INET, serverIP.c_str(), &m_DestAddr.sin_addr);
		int64_t s = atoll(serial.c_str());
		m_SerialQ = htonll(s);

		Disconnect();

		m_ClientToken = rand() | (rand() << 16);
		m_Sock = socket(AF_INET, SOCK_DGRAM, 0);

		char rcvBuf[512];

		LOG_F(INFO, "Connecting to %s:%d...", serverIP.c_str(), serverPort);

		AuthIntro intro(m_ClientToken, m_SerialQ);
		sendto(m_Sock, (const char*)&intro, 56, 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));
		
		int bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding, disconnecting");
			Disconnect();
			return;
		}

		AuthChallenge* challenge = (AuthChallenge*)rcvBuf;

		if (!(challenge->act1 == 3 && challenge->act2 == 0 && challenge->act3 == 0 && challenge->act4 == 0))
		{
			LOG_F(ERROR, "Invalid auth challenge packet (pump offline?), disconnecting");
			Disconnect();
			return;
		}

		m_CSID = challenge->hdr.csid;
		m_DSID = challenge->hdr.dsid;
		m_ServerToken = challenge->serverToken;

		LOG_F(INFO, "Received handshake, CSID=%08X, DSID=%08X, server token %08X", m_CSID, m_DSID, m_ServerToken);

		MD5_Init(&ctx);
		MD5_Update(&ctx, &m_ClientToken, 4);
		MD5_Update(&ctx, &m_ServerToken, 4);
		MD5_Update(&ctx, m_HashedPW, 16);

		unsigned char respdata[16];
		MD5_Final(respdata, &ctx);

		AuthResponse resp(m_CSID, m_DSID, respdata);
		sendto(m_Sock, (const char*)&resp, sizeof(resp), 0, (sockaddr*)&m_DestAddr, sizeof(m_DestAddr));

		bytesReceived = RecvWithTimeout(rcvBuf, sizeof(rcvBuf), 2000);

		if (bytesReceived == 0)
		{
			LOG_F(ERROR, "Server not responding to auth response, disconnecting");
			Disconnect();
			return;
		}

		uint32_t act = *(uint32_t*)(&rcvBuf[sizeof(PacketHeader)]);
		if (act != 0x00000005)
		{
			LOG_F(ERROR, "Server returned error in auth, disconnecting");
			Disconnect();
			return;

		}
		m_LastPacketRcvTime = std::chrono::system_clock::now();
		UpdateConnectionStatus(ConnectionStatus::Connected);

		LOG_F(INFO, "Connection complete.");

		return;
	}